

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall
QBoxLayout::insertWidget(QBoxLayout *this,int index,QWidget *widget,int stretch,Alignment alignment)

{
  QBoxLayoutPrivate *this_00;
  bool bVar1;
  int iVar2;
  QWidgetItem *this_01;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,widget);
  if (bVar1) {
    QLayout::addChildWidget(&this->super_QLayout,widget);
    iVar2 = QBoxLayoutPrivate::validateIndex(this_00,index);
    this_01 = QLayoutPrivate::createWidgetItem(&this->super_QLayout,widget);
    QLayoutItem::setAlignment(&this_01->super_QLayoutItem,alignment);
    local_40 = (QBoxLayoutItem *)operator_new(0x10);
    local_40->item = &this_01->super_QLayoutItem;
    local_40->stretch = stretch;
    local_40->magic = false;
    QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
              ((QPodArrayOps<QBoxLayoutItem*> *)&this_00->list,(long)iVar2,&local_40);
    QList<QBoxLayoutItem_*>::begin(&this_00->list);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::insertWidget(int index, QWidget *widget, int stretch,
                              Qt::Alignment alignment)
{
    Q_D(QBoxLayout);
    if (!d->checkWidget(widget))
         return;
    addChildWidget(widget);
    index = d->validateIndex(index);
    QWidgetItem *b = QLayoutPrivate::createWidgetItem(this, widget);
    b->setAlignment(alignment);

    QBoxLayoutItem *it = new QBoxLayoutItem(b, stretch);
    d->list.insert(index, it);
    invalidate();
}